

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackTGZGenerator.cxx
# Opt level: O0

void __thiscall cmCPackTGZGenerator::cmCPackTGZGenerator(cmCPackTGZGenerator *this)

{
  allocator local_31;
  string local_30;
  cmCPackTGZGenerator *local_10;
  cmCPackTGZGenerator *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_30,"paxr",&local_31);
  cmCPackArchiveGenerator::cmCPackArchiveGenerator
            (&this->super_cmCPackArchiveGenerator,CompressGZip,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  (this->super_cmCPackArchiveGenerator).super_cmCPackGenerator.super_cmObject._vptr_cmObject =
       (_func_int **)&PTR__cmCPackTGZGenerator_00b165d8;
  return;
}

Assistant:

cmCPackTGZGenerator::cmCPackTGZGenerator()
  :cmCPackArchiveGenerator(cmArchiveWrite::CompressGZip,
                           "paxr")
{
}